

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O1

int SampleFormatIsValid(PaSampleFormat format)

{
  if (((0x20 < (format & 0xffffffff7fffffff)) || ((0x100010116U >> (format & 0x3f) & 1) == 0)) &&
     ((format & 0xffffffff7fffffff) != 0x10000)) {
    return 0;
  }
  return 1;
}

Assistant:

static int SampleFormatIsValid( PaSampleFormat format )
{
    switch( format & ~paNonInterleaved )
    {
    case paFloat32: return 1;
    case paInt16: return 1;
    case paInt32: return 1;
    case paInt24: return 1;
    case paInt8: return 1;
    case paUInt8: return 1;
    case paCustomFormat: return 1;
    default: return 0;
    }
}